

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

bool am_generalize_script_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object scroll_menu;
  Am_Object script_window;
  Am_Value_List sel_list;
  
  Am_Object::Get_Object((Am_Object *)&sel_list,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&sel_list);
  Am_Object::~Am_Object((Am_Object *)&sel_list);
  pAVar2 = Am_Object::Get(&script_window,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&scroll_menu,pAVar2);
  pAVar2 = Am_Object::Get(&scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List(&sel_list,pAVar2);
  bVar1 = Am_Value_List::Valid(&sel_list);
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&scroll_menu);
  Am_Object::~Am_Object(&script_window);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, am_generalize_script_active)
{
  Am_Object script_window = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  return sel_list.Valid();
}